

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

bool __thiscall
glcts::InterfaceMatchingCase::checkSurface
          (InterfaceMatchingCase *this,Surface *surface,RGBA expectedColor)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  iVar2 = surface->m_height;
  if (surface->m_height < 1) {
    iVar2 = 0;
  }
  iVar3 = 0;
  for (iVar4 = 0; iVar4 != iVar2; iVar4 = iVar4 + 1) {
    uVar1 = surface->m_width;
    iVar6 = uVar1 * iVar4;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = 0;
    }
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      iVar3 = iVar3 + (uint)(*(deUint32 *)((long)(surface->m_pixels).m_ptr + (long)iVar6 * 4) !=
                            expectedColor.m_value);
      iVar6 = iVar6 + 1;
    }
  }
  return iVar3 == 0;
}

Assistant:

bool checkSurface(tcu::Surface surface, tcu::RGBA expectedColor)
	{
		int numFailedPixels = 0;
		for (int y = 0; y < surface.getHeight(); y++)
		{
			for (int x = 0; x < surface.getWidth(); x++)
			{
				if (surface.getPixel(x, y) != expectedColor)
					numFailedPixels += 1;
			}
		}
		return (numFailedPixels == 0);
	}